

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::AddCompileOptions
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  bool bVar2;
  int iVar3;
  long *plVar4;
  char *pcVar5;
  size_t sVar6;
  string *psVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  long *plVar10;
  size_type *psVar11;
  pointer pbVar12;
  string langFlagRegexVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  RegularExpression r;
  string local_220;
  string *local_200;
  string local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  string *local_1b8;
  cmListFileBacktrace *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [72];
  char *local_f0;
  
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  local_200 = flags;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"CMAKE_","");
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_220,(ulong)(lang->_M_dataplus)._M_p);
  local_1a8._0_8_ = local_1a8 + 0x10;
  plVar10 = plVar4 + 2;
  if ((long *)*plVar4 == plVar10) {
    local_1a8._16_8_ = *plVar10;
    local_1a8._24_8_ = plVar4[3];
  }
  else {
    local_1a8._16_8_ = *plVar10;
    local_1a8._0_8_ = (long *)*plVar4;
  }
  local_1a8._8_8_ = plVar4[1];
  *plVar4 = (long)plVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_1a8);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  psVar11 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_1f8.field_2._M_allocated_capacity = *psVar11;
    local_1f8.field_2._8_8_ = plVar4[3];
  }
  else {
    local_1f8.field_2._M_allocated_capacity = *psVar11;
    local_1f8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_1f8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = cmMakefile::GetDefinition(this->Makefile,&local_1f8);
  local_1b8 = lang;
  if (pcVar5 == (char *)0x0) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"COMPILE_FLAGS","");
    pcVar5 = cmGeneratorTarget::GetProperty(target,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
    if (pcVar5 != (char *)0x0) {
      (*this->_vptr_cmLocalGenerator[7])(this,local_200,pcVar5);
    }
    local_1a8._0_8_ = (char *)0x0;
    local_1a8._8_8_ = (pointer)0x0;
    local_1a8._16_8_ = (char *)0x0;
    cmGeneratorTarget::GetCompileOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1a8,config,lang);
    for (pbVar12 = (pointer)local_1a8._0_8_; pbVar12 != (pointer)local_1a8._8_8_;
        pbVar12 = pbVar12 + 1) {
      (*this->_vptr_cmLocalGenerator[8])(this,local_200,pbVar12);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8);
  }
  else {
    local_f0 = (char *)0x0;
    cmsys::RegularExpression::compile((RegularExpression *)local_1a8,pcVar5);
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"COMPILE_FLAGS","");
    pcVar5 = cmGeneratorTarget::GetProperty(target,&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if (pcVar5 != (char *)0x0) {
      cmSystemTools::ParseWindowsCommandLine(pcVar5,&local_1d8);
    }
    cmGeneratorTarget::GetCompileOptions(target,&local_1d8,config,lang);
    if (local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar12 = local_1d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar2 = cmsys::RegularExpression::find
                          ((RegularExpression *)local_1a8,(pbVar12->_M_dataplus)._M_p);
        if (bVar2) {
          (*this->_vptr_cmLocalGenerator[8])(this,local_200,pbVar12);
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 !=
               local_1d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d8);
    if (local_f0 != (char *)0x0) {
      operator_delete__(local_f0);
    }
  }
  p_Var9 = (target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    local_1b0 = &this->DirectoryBacktrace;
    do {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,*(long *)(p_Var9 + 1),
                 (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
      std::__cxx11::string::append((char *)local_1a8);
      pcVar5 = cmGeneratorTarget::GetProperty(target,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
      }
      if (pcVar5 == (char *)0x0) {
        iVar3 = 10;
      }
      else {
        this_00 = this->Makefile;
        local_1a8._0_8_ = local_1a8 + 0x10;
        sVar6 = strlen(pcVar5);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar5,pcVar5 + sVar6);
        bVar2 = cmMakefile::IsLaterStandard
                          (this_00,(string *)(p_Var9 + 1),(string *)local_1a8,(string *)(p_Var9 + 2)
                          );
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
        }
        iVar3 = 0;
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"The COMPILE_FEATURES property of target \"",0x29);
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(target);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar7->_M_dataplus)._M_p,
                              psVar7->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" was evaluated when computing the link implementation, and the \"",
                     0x41);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"_STANDARD\" was \"",0x10);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)(p_Var9 + 2),(long)p_Var9[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,
                     "\" for that computation.  Computing the COMPILE_FEATURES based on the link implementation resulted in a higher \""
                     ,0x6f);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"_STANDARD\" \"",0xc);
          sVar6 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,sVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,
                     "\".  This is not permitted. The COMPILE_FEATURES may not both depend on and be depended on by the link implementation."
                     ,0x75);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&local_220,local_1b0)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          iVar3 = 1;
        }
      }
      if ((iVar3 != 10) && (iVar3 != 0)) goto LAB_003b184f;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  AddCompilerRequirementFlag(this,local_200,target,local_1b8);
LAB_003b184f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddCompileOptions(std::string& flags,
                                         cmGeneratorTarget* target,
                                         const std::string& lang,
                                         const std::string& config)
{
  std::string langFlagRegexVar = std::string("CMAKE_") + lang + "_FLAG_REGEX";

  if (const char* langFlagRegexStr =
        this->Makefile->GetDefinition(langFlagRegexVar)) {
    // Filter flags acceptable to this language.
    cmsys::RegularExpression r(langFlagRegexStr);
    std::vector<std::string> opts;
    if (const char* targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      cmSystemTools::ParseWindowsCommandLine(targetFlags, opts);
    }
    target->GetCompileOptions(opts, config, lang);
    for (std::vector<std::string>::const_iterator i = opts.begin();
         i != opts.end(); ++i) {
      if (r.find(i->c_str())) {
        // (Re-)Escape this flag.  COMPILE_FLAGS were already parsed
        // as a command line above, and COMPILE_OPTIONS are escaped.
        this->AppendFlagEscape(flags, *i);
      }
    }
  } else {
    // Use all flags.
    if (const char* targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      // COMPILE_FLAGS are not escaped for historical reasons.
      this->AppendFlags(flags, targetFlags);
    }
    std::vector<std::string> opts;
    target->GetCompileOptions(opts, config, lang);
    for (std::vector<std::string>::const_iterator i = opts.begin();
         i != opts.end(); ++i) {
      // COMPILE_OPTIONS are escaped.
      this->AppendFlagEscape(flags, *i);
    }
  }

  for (std::map<std::string, std::string>::const_iterator it =
         target->GetMaxLanguageStandards().begin();
       it != target->GetMaxLanguageStandards().end(); ++it) {
    const char* standard = target->GetProperty(it->first + "_STANDARD");
    if (!standard) {
      continue;
    }
    if (this->Makefile->IsLaterStandard(it->first, standard, it->second)) {
      std::ostringstream e;
      e << "The COMPILE_FEATURES property of target \"" << target->GetName()
        << "\" was evaluated when computing the link "
           "implementation, and the \""
        << it->first << "_STANDARD\" was \"" << it->second
        << "\" for that computation.  Computing the "
           "COMPILE_FEATURES based on the link implementation resulted in a "
           "higher \""
        << it->first << "_STANDARD\" \"" << standard
        << "\".  "
           "This is not permitted. The COMPILE_FEATURES may not both depend "
           "on "
           "and be depended on by the link implementation."
        << std::endl;
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
    }
  }
  this->AddCompilerRequirementFlag(flags, target, lang);
}